

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_hqresize.cpp
# Opt level: O2

void scale3x(uint32 *input,uint32 *output,size_t width,size_t height)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint32 uVar7;
  uint32 uVar8;
  ulong uVar9;
  int iVar10;
  uint32 uVar11;
  long lVar12;
  ulong uVar13;
  uint32 *puVar14;
  uint32 *puVar15;
  uint32 uVar16;
  long lVar17;
  uint32 uVar18;
  size_t sVar19;
  uint32 uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  uint32 uVar24;
  bool bVar25;
  uint32 *local_f0;
  uint32 *local_e8;
  long local_e0;
  
  local_e8 = output + width * 6 + 1;
  local_f0 = output + width * 3 + 2;
  local_e0 = 0;
  uVar9 = 0;
  puVar15 = output;
  do {
    if (uVar9 == width) {
      return;
    }
    iVar10 = (int)uVar9 + -1;
    if (uVar9 == 0) {
      iVar10 = 0;
    }
    uVar13 = uVar9;
    if (uVar9 < width - 1) {
      uVar13 = uVar9 + 1;
    }
    lVar12 = (long)(int)uVar13;
    lVar23 = 0;
    uVar13 = 0;
    puVar14 = input;
    sVar19 = height;
    while( true ) {
      lVar17 = 0;
      if (uVar13 != 0) {
        lVar17 = uVar13 - 1;
      }
      bVar25 = sVar19 == 0;
      sVar19 = sVar19 - 1;
      if (bVar25) break;
      uVar21 = uVar13;
      if (uVar13 < height - 1) {
        uVar21 = uVar13 + 1;
      }
      uVar1 = *(uint32 *)
               ((long)puVar14 + ((long)((local_e0 + (ulong)(uVar9 != 0) * -4) * 0x40000000) >> 0x1e)
               );
      uVar16 = *(uint32 *)((long)puVar14 + local_e0);
      uVar18 = puVar14[lVar12];
      if (uVar1 == uVar18) {
LAB_003e5866:
        puVar15[lVar23] = uVar16;
        local_f0[lVar23 + -2] = uVar16;
        lVar17 = (uVar13 * 3 + 2) * width * 3;
        local_e8[lVar23 + -1] = uVar16;
        puVar15[lVar23 + 1] = uVar16;
        local_f0[lVar23 + -1] = uVar16;
        local_e8[lVar23] = uVar16;
        puVar15[lVar23 + 2] = uVar16;
        local_f0[lVar23] = uVar16;
      }
      else {
        lVar17 = lVar17 * width;
        lVar22 = uVar21 * width;
        uVar2 = input[uVar9 + lVar17];
        uVar3 = input[uVar9 + lVar22];
        if (uVar2 == uVar3) goto LAB_003e5866;
        uVar4 = uVar2;
        if (uVar16 == input[iVar10 + lVar17]) {
          uVar4 = uVar16;
        }
        if (uVar2 != uVar18) {
          uVar4 = uVar16;
        }
        uVar20 = uVar3;
        if (uVar16 == input[iVar10 + lVar22]) {
          uVar20 = uVar16;
        }
        uVar5 = uVar18;
        uVar11 = uVar2;
        if (uVar16 == input[lVar12 + lVar17]) {
          uVar5 = uVar16;
          uVar11 = uVar4;
        }
        uVar6 = uVar16;
        uVar7 = uVar16;
        uVar24 = uVar16;
        if (uVar18 == uVar3) {
          uVar6 = uVar3;
          uVar7 = uVar20;
          uVar24 = uVar5;
        }
        uVar20 = uVar18;
        uVar5 = uVar3;
        if (uVar16 == input[lVar12 + lVar22]) {
          uVar20 = uVar24;
          uVar5 = uVar7;
        }
        uVar8 = uVar2;
        if (uVar2 != uVar18) {
          uVar20 = uVar24;
          uVar8 = uVar16;
        }
        uVar18 = uVar16;
        if (uVar16 != input[iVar10 + lVar17]) {
          uVar18 = uVar1;
        }
        if (uVar1 != uVar3) {
          uVar18 = uVar16;
        }
        uVar24 = uVar1;
        if (uVar16 == input[iVar10 + lVar22]) {
          uVar24 = uVar18;
        }
        if (uVar1 != uVar3) {
          uVar3 = uVar16;
          uVar5 = uVar7;
        }
        bVar25 = uVar2 != uVar1;
        if (bVar25) {
          uVar2 = uVar16;
        }
        puVar15[lVar23] = uVar2;
        if (bVar25) {
          uVar24 = uVar18;
        }
        local_f0[lVar23 + -2] = uVar24;
        local_e8[lVar23 + -1] = uVar3;
        if (bVar25) {
          uVar11 = uVar4;
        }
        puVar15[lVar23 + 1] = uVar11;
        local_f0[lVar23 + -1] = uVar16;
        local_e8[lVar23] = uVar5;
        puVar15[lVar23 + 2] = uVar8;
        local_f0[lVar23] = uVar20;
        lVar17 = width * 6 + lVar23;
        uVar16 = uVar6;
      }
      output[uVar9 * 3 + lVar17 + 2] = uVar16;
      puVar14 = puVar14 + width;
      lVar23 = lVar23 + width * 9;
      uVar13 = uVar13 + 1;
    }
    local_e0 = local_e0 + 4;
    puVar15 = puVar15 + 3;
    local_e8 = local_e8 + 3;
    local_f0 = local_f0 + 3;
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static void scale3x(uint32* const input, uint32* const output, const size_t width, const size_t height)
{
	const size_t scaledWidth = 3 * width;

	for (size_t i = 0; i < width; ++i)
	{
		const int iMinus = (i > 0        ) ? (i - 1) : 0;
		const int iPlus  = (i < width - 1) ? (i + 1) : i;

		for (size_t j = 0; j < height; ++j)
		{
			const size_t jMinus = (j > 0          ) ? (j - 1) : 0;
			const size_t jPlus  = (j < height - 1 ) ? (j + 1) : j;

			const uint32 A = input[iMinus + width * jMinus];
			const uint32 B = input[iMinus + width * j     ];
			const uint32 C = input[iMinus + width * jPlus ];
			const uint32 D = input[i      + width * jMinus];
			const uint32 E = input[i      + width * j     ];
			const uint32 F = input[i      + width * jPlus ];
			const uint32 G = input[iPlus  + width * jMinus];
			const uint32 H = input[iPlus  + width * j     ];
			const uint32 I = input[iPlus  + width * jPlus ];

			if (B != H && D != F)
			{
				output[3 * i     + scaledWidth *  3 * j     ] = D == B ? D : E;
				output[3 * i     + scaledWidth * (3 * j + 1)] = (D == B && E != C) || (B == F && E != A) ? B : E;
				output[3 * i     + scaledWidth * (3 * j + 2)] = B == F ? F : E;
				output[3 * i + 1 + scaledWidth *  3 * j     ] = (D == B && E != G) || (D == H && E != A) ? D : E;
				output[3 * i + 1 + scaledWidth * (3 * j + 1)] = E;
				output[3 * i + 1 + scaledWidth * (3 * j + 2)] = (B == F && E != I) || (H == F && E != C) ? F : E;
				output[3 * i + 2 + scaledWidth *  3 * j     ] = D == H ? D : E;
				output[3 * i + 2 + scaledWidth * (3 * j + 1)] = (D == H && E != I) || (H == F && E != G) ? H : E;
				output[3 * i + 2 + scaledWidth * (3 * j + 2)] = H == F ? F : E;
			}                                       
			else
			{
				output[3 * i     + scaledWidth *  3 * j     ] = E;
				output[3 * i     + scaledWidth * (3 * j + 1)] = E;
				output[3 * i     + scaledWidth * (3 * j + 2)] = E;
				output[3 * i + 1 + scaledWidth *  3 * j     ] = E;
				output[3 * i + 1 + scaledWidth * (3 * j + 1)] = E;
				output[3 * i + 1 + scaledWidth * (3 * j + 2)] = E;
				output[3 * i + 2 + scaledWidth *  3 * j     ] = E;
				output[3 * i + 2 + scaledWidth * (3 * j + 1)] = E;
				output[3 * i + 2 + scaledWidth * (3 * j + 2)] = E;
			}
		}
	}
}